

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PP_FDTD_1D.cpp
# Opt level: O0

void __thiscall
PP_FDTD_1D::PP_FDTD_1D
          (PP_FDTD_1D *this,double _dt,double _DT,double _dz,double _DZ,double _R,double _L,
          double _C,double _G)

{
  double **ppdVar1;
  ulong uVar2;
  double dVar3;
  double _G_local;
  double _C_local;
  double _L_local;
  double _R_local;
  double _DZ_local;
  double _dz_local;
  double _DT_local;
  double _dt_local;
  PP_FDTD_1D *this_local;
  
  this->_vptr_PP_FDTD_1D = (_func_int **)&PTR__PP_FDTD_1D_00125cc8;
  PP_smartAlloc::PP_smartAlloc(&this->myAllocator);
  this->dt = _dt;
  this->DT = _DT;
  this->dz = _dz;
  this->DZ = _DZ;
  this->R = _R;
  this->L = _L;
  this->C = _C;
  this->G = _G;
  dVar3 = this->DT / this->dt;
  uVar2 = (ulong)dVar3;
  this->Nt = uVar2 | (long)(dVar3 - 9.223372036854776e+18) & (long)uVar2 >> 0x3f;
  dVar3 = this->DZ / this->dz;
  uVar2 = (ulong)dVar3;
  this->Nz = uVar2 | (long)(dVar3 - 9.223372036854776e+18) & (long)uVar2 >> 0x3f;
  ppdVar1 = PP_smartAlloc::allocateDouble(&this->myAllocator,this->Nt,this->Nz);
  this->V = ppdVar1;
  ppdVar1 = PP_smartAlloc::allocateDouble(&this->myAllocator,this->Nt,this->Nz);
  this->I = ppdVar1;
  return;
}

Assistant:

PP_FDTD_1D::PP_FDTD_1D(double _dt, double _DT, double _dz, double _DZ, double _R, double _L, double _C, double _G)
{
    dt = _dt;
    DT = _DT;
    dz = _dz;
    DZ = _DZ;
    R = _R;
    L = _L;
    C = _C;
    G = _G;
    Nt = (unsigned long) (DT/dt);
    Nz = (unsigned long) (DZ/dz);
    V = myAllocator.allocateDouble(Nt,Nz);
    I = myAllocator.allocateDouble(Nt,Nz);
}